

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFuncType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  bool *pbVar1;
  Offset OVar2;
  int *piVar3;
  Module *this_00;
  size_t sVar4;
  tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_> tVar5;
  undefined8 *puVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  int *piVar16;
  bool bVar17;
  __uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_38;
  
  if (1000 < param_count) {
    pcVar10 = "FuncType param count exceeds maximum value";
LAB_00149a55:
    PrintError(this,pcVar10);
    return (Result)Error;
  }
  if (1000 < result_count) {
    pcVar10 = "FuncType result count exceeds maximum value";
    goto LAB_00149a55;
  }
  pcVar10 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar4 = strlen(pcVar10);
  tVar5.super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       operator_new(0x48);
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x18) = sVar4;
  *(char **)((long)tVar5.
                   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                   .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x20) =
       pcVar10;
  *(Offset *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x28) = OVar2;
  *(undefined4 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x38) = 4;
  *(undefined ***)
   tVar5.
   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
   super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       &PTR__TypeModuleField_0018ff38;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) = 0;
  puVar6 = (undefined8 *)operator_new(0x88);
  puVar6[1] = 0;
  puVar6[2] = 0;
  *(undefined8 *)((long)puVar6 + 0x14) = 0;
  *(undefined8 *)((long)puVar6 + 0x1c) = 0;
  puVar6[5] = puVar6 + 7;
  puVar6[6] = 0;
  *(undefined1 *)(puVar6 + 7) = 0;
  *(undefined4 *)(puVar6 + 9) = 0;
  *puVar6 = &PTR__FuncType_0018ffc0;
  puVar6[10] = 0;
  puVar6[0xb] = 0;
  puVar6[0xc] = 0;
  puVar6[0xd] = 0;
  puVar6[0xe] = 0;
  puVar6[0xf] = 0;
  *(undefined1 *)(puVar6 + 0x10) = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)(puVar6 + 10),param_types,
             param_types + param_count);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)(puVar6 + 0xd),result_types,
             result_types + result_count);
  piVar8 = (int *)puVar6[10];
  piVar3 = (int *)puVar6[0xb];
  uVar11 = (long)piVar3 - (long)piVar8;
  lVar9 = (long)uVar11 >> 5;
  piVar12 = piVar8;
  uVar13 = uVar11;
  if (0 < lVar9) {
    piVar12 = (int *)((uVar11 & 0xffffffffffffffe0) + (long)piVar8);
    lVar15 = lVar9 + 1;
    piVar7 = piVar8 + 4;
    do {
      if (piVar7[-4] == -5) {
        piVar7 = piVar7 + -4;
        goto LAB_00149c34;
      }
      if (piVar7[-2] == -5) {
        piVar7 = piVar7 + -2;
        goto LAB_00149c34;
      }
      if (*piVar7 == -5) goto LAB_00149c34;
      if (piVar7[2] == -5) {
        piVar7 = piVar7 + 2;
        goto LAB_00149c34;
      }
      lVar15 = lVar15 + -1;
      piVar7 = piVar7 + 8;
    } while (1 < lVar15);
    uVar13 = (long)piVar3 - (long)piVar12;
  }
  lVar15 = (long)uVar13 >> 3;
  if (lVar15 == 1) {
LAB_00149c1d:
    piVar7 = piVar12;
    if (*piVar12 != -5) {
      piVar7 = piVar3;
    }
LAB_00149c34:
    bVar17 = true;
    if (piVar7 == piVar3) goto LAB_00149c40;
  }
  else {
    if (lVar15 == 2) {
LAB_00149bf9:
      piVar7 = piVar12;
      if (*piVar12 != -5) {
        piVar12 = piVar12 + 2;
        goto LAB_00149c1d;
      }
      goto LAB_00149c34;
    }
    if (lVar15 == 3) {
      piVar7 = piVar12;
      if (*piVar12 != -5) {
        piVar12 = piVar12 + 2;
        goto LAB_00149bf9;
      }
      goto LAB_00149c34;
    }
LAB_00149c40:
    piVar12 = (int *)puVar6[0xd];
    piVar7 = (int *)puVar6[0xe];
    uVar13 = (long)piVar7 - (long)piVar12;
    if (0 < (long)uVar13 >> 5) {
      piVar14 = (int *)((uVar13 & 0xffffffffffffffe0) + (long)piVar12);
      lVar15 = ((long)uVar13 >> 5) + 1;
      piVar16 = piVar12 + 4;
      do {
        if (piVar16[-4] == -5) {
          piVar16 = piVar16 + -4;
          goto LAB_00149d06;
        }
        if (piVar16[-2] == -5) {
          piVar16 = piVar16 + -2;
          goto LAB_00149d06;
        }
        if (*piVar16 == -5) goto LAB_00149d06;
        if (piVar16[2] == -5) {
          piVar16 = piVar16 + 2;
          goto LAB_00149d06;
        }
        lVar15 = lVar15 + -1;
        piVar16 = piVar16 + 8;
      } while (1 < lVar15);
      uVar13 = (long)piVar7 - (long)piVar14;
      piVar12 = piVar14;
    }
    lVar15 = (long)uVar13 >> 3;
    if (lVar15 == 1) {
LAB_00149ce3:
      piVar16 = piVar12;
      if (*piVar12 != -5) {
        piVar16 = piVar7;
      }
    }
    else if (lVar15 == 2) {
LAB_00149cd3:
      piVar16 = piVar12;
      if (*piVar12 != -5) {
        piVar12 = piVar12 + 2;
        goto LAB_00149ce3;
      }
    }
    else {
      piVar16 = piVar7;
      if ((lVar15 == 3) && (piVar16 = piVar12, *piVar12 != -5)) {
        piVar12 = piVar12 + 2;
        goto LAB_00149cd3;
      }
    }
LAB_00149d06:
    bVar17 = piVar16 != piVar7;
  }
  this_00 = this->module_;
  (this_00->features_used).simd = (bool)((this_00->features_used).simd | bVar17);
  if (0 < lVar9) {
    piVar12 = (int *)((uVar11 & 0xffffffffffffffe0) + (long)piVar8);
    lVar9 = lVar9 + 1;
    piVar8 = piVar8 + 4;
    do {
      if (piVar8[-4] == -0x17) {
        piVar8 = piVar8 + -4;
        goto LAB_00149da6;
      }
      if (piVar8[-2] == -0x17) {
        piVar8 = piVar8 + -2;
        goto LAB_00149da6;
      }
      if (*piVar8 == -0x17) goto LAB_00149da6;
      if (piVar8[2] == -0x17) {
        piVar8 = piVar8 + 2;
        goto LAB_00149da6;
      }
      lVar9 = lVar9 + -1;
      piVar8 = piVar8 + 8;
    } while (1 < lVar9);
    uVar11 = (long)piVar3 - (long)piVar12;
    piVar8 = piVar12;
  }
  lVar9 = (long)uVar11 >> 3;
  if (lVar9 == 1) {
LAB_00149d8a:
    if (*piVar8 != -0x17) {
      piVar8 = piVar3;
    }
LAB_00149da6:
    bVar17 = true;
    if (piVar8 != piVar3) goto LAB_00149e58;
  }
  else {
    if (lVar9 == 2) {
LAB_00149d81:
      if (*piVar8 != -0x17) {
        piVar8 = piVar8 + 2;
        goto LAB_00149d8a;
      }
      goto LAB_00149da6;
    }
    if (lVar9 == 3) {
      if (*piVar8 != -0x17) {
        piVar8 = piVar8 + 2;
        goto LAB_00149d81;
      }
      goto LAB_00149da6;
    }
  }
  piVar8 = (int *)puVar6[0xd];
  piVar3 = (int *)puVar6[0xe];
  uVar13 = (long)piVar3 - (long)piVar8;
  if (0 < (long)uVar13 >> 5) {
    piVar7 = (int *)((uVar13 & 0xffffffffffffffe0) + (long)piVar8);
    lVar9 = ((long)uVar13 >> 5) + 1;
    piVar12 = piVar8 + 4;
    do {
      if (piVar12[-4] == -0x17) {
        piVar12 = piVar12 + -4;
        goto LAB_00149e52;
      }
      if (piVar12[-2] == -0x17) {
        piVar12 = piVar12 + -2;
        goto LAB_00149e52;
      }
      if (*piVar12 == -0x17) goto LAB_00149e52;
      if (piVar12[2] == -0x17) {
        piVar12 = piVar12 + 2;
        goto LAB_00149e52;
      }
      lVar9 = lVar9 + -1;
      piVar12 = piVar12 + 8;
    } while (1 < lVar9);
    uVar13 = (long)piVar3 - (long)piVar7;
    piVar8 = piVar7;
  }
  lVar9 = (long)uVar13 >> 3;
  if (lVar9 == 1) {
LAB_00149e36:
    piVar12 = piVar8;
    if (*piVar8 != -0x17) {
      piVar12 = piVar3;
    }
  }
  else if (lVar9 == 2) {
LAB_00149e2d:
    piVar12 = piVar8;
    if (*piVar8 != -0x17) {
      piVar8 = piVar8 + 2;
      goto LAB_00149e36;
    }
  }
  else {
    piVar12 = piVar3;
    if ((lVar9 == 3) && (piVar12 = piVar8, *piVar8 != -0x17)) {
      piVar8 = piVar8 + 2;
      goto LAB_00149e2d;
    }
  }
LAB_00149e52:
  bVar17 = piVar12 != piVar3;
LAB_00149e58:
  pbVar1 = &(this_00->features_used).exceptions;
  *pbVar1 = (bool)(*pbVar1 | bVar17);
  *(undefined8 **)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) = puVar6;
  local_38._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       tVar5.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
  Module::AppendField(this_00,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                               *)&local_38);
  if ((_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl == (TypeModuleField *)0x0)
  {
    return (Result)Ok;
  }
  (**(code **)(*(long *)local_38._M_t.
                        super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                        .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8))();
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFuncType(Index index,
                                  Index param_count,
                                  Type* param_types,
                                  Index result_count,
                                  Type* result_types) {
  if (param_count > kMaxFunctionParams) {
    PrintError("FuncType param count exceeds maximum value");
    return Result::Error;
  }

  if (result_count > kMaxFunctionResults) {
    PrintError("FuncType result count exceeds maximum value");
    return Result::Error;
  }

  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto func_type = std::make_unique<FuncType>();
  func_type->sig.param_types.assign(param_types, param_types + param_count);
  func_type->sig.result_types.assign(result_types, result_types + result_count);

  module_->features_used.simd |=
      std::any_of(func_type->sig.param_types.begin(),
                  func_type->sig.param_types.end(),
                  [](auto x) { return x == Type::V128; }) ||
      std::any_of(func_type->sig.result_types.begin(),
                  func_type->sig.result_types.end(),
                  [](auto x) { return x == Type::V128; });
  module_->features_used.exceptions |=
      std::any_of(func_type->sig.param_types.begin(),
                  func_type->sig.param_types.end(),
                  [](auto x) { return x == Type::ExnRef; }) ||
      std::any_of(func_type->sig.result_types.begin(),
                  func_type->sig.result_types.end(),
                  [](auto x) { return x == Type::ExnRef; });

  field->type = std::move(func_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}